

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

DdNode * Cudd_bddIthVar(DdManager *dd,int i)

{
  DdManager *local_28;
  DdNode *res;
  int i_local;
  DdManager *dd_local;
  
  if ((uint)i < 0x7ffffffe) {
    if (i < dd->size) {
      local_28 = (DdManager *)dd->vars[i];
    }
    else {
      local_28 = (DdManager *)cuddUniqueInter(dd,i,dd->one,(DdNode *)((ulong)dd->one ^ 1));
    }
    dd_local = local_28;
  }
  else {
    dd_local = (DdManager *)0x0;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);
    if (i < dd->size) {
        res = dd->vars[i];
    } else {
        res = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
    }

    return(res);

}